

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::tonk_close(Connection *this)

{
  ErrorResult *pEVar1;
  allocator local_39;
  Result local_38;
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"Application requested session end",&local_39);
  pEVar1 = (ErrorResult *)operator_new(0x38);
  pEVar1->Source = "Connection::tonk_close";
  std::__cxx11::string::string((string *)&pEVar1->Description,local_30);
  pEVar1->Type = Tonk;
  pEVar1->Code = 0xc;
  local_38.Error = pEVar1;
  RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,0xc,&local_38);
  Result::~Result(&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Connection::tonk_close()
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    // Begin disconnect if it has not happened yet
    SelfRefCount.StartShutdown(Tonk_AppRequest, Result("Connection::tonk_close", "Application requested session end", ErrorType::Tonk, Tonk_AppRequest));

    // The disconnection will complete on the timer tick green thread
}